

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_graph_dump_dot(ggml_cgraph *gb,ggml_cgraph *gf,char *filename)

{
  ggml_tensor **ppgVar1;
  ggml_type gVar2;
  ggml_tensor *pgVar3;
  undefined4 uVar4;
  FILE *__s;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ulong uVar7;
  long lVar8;
  ggml_tensor *pgVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  int64_t iVar13;
  char *pcVar14;
  char *pcVar15;
  int64_t iVar16;
  int i_1;
  int i;
  ulong uVar17;
  int j;
  long lVar18;
  bool bVar19;
  char color [16];
  char label [16];
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x186c,"GGML_ASSERT(%s) failed","fp");
  }
  fwrite("digraph G {\n",0xc,1,__s);
  fwrite("  newrank = true;\n",0x12,1,__s);
  fwrite("  rankdir = TB;\n",0x10,1,__s);
  uVar17 = 0;
  do {
    if ((long)gb->n_nodes <= (long)uVar17) {
      for (uVar17 = 0; (long)uVar17 < (long)gb->n_leafs; uVar17 = uVar17 + 1) {
        pgVar3 = gb->leafs[uVar17];
        color._4_4_ = SUB84(color._0_8_,4) & 0xffffff00;
        builtin_strncpy(color,"pink",4);
        fprintf(__s,"  \"%p\" [ style = filled; fillcolor = %s; shape = record; label=\"<x>",pgVar3,
                color);
        gVar2 = pgVar3->type;
        if (pgVar3->name[0] == '\0') {
          pcVar12 = "NONE";
          if (gVar2 < GGML_TYPE_COUNT) {
            pcVar12 = type_traits[gVar2].type_name;
          }
          fprintf(__s,"(%s)|",pcVar12);
        }
        else {
          pcVar12 = "NONE";
          if (gVar2 < GGML_TYPE_COUNT) {
            pcVar12 = type_traits[gVar2].type_name;
          }
          fprintf(__s,"%s (%s)|",pgVar3->name,pcVar12);
        }
        fprintf(__s,"CONST %d [%ld, %ld]",uVar17 & 0xffffffff,pgVar3->ne[0],pgVar3->ne[1]);
        if ((pgVar3->ne[1] * pgVar3->ne[0] * pgVar3->ne[2] * pgVar3->ne[3] < 5) &&
           (pgVar3->data != (void *)0x0)) {
          fwrite(" | (",4,1,__s);
          for (lVar18 = 0; lVar8 = pgVar3->ne[1] * pgVar3->ne[0] * pgVar3->ne[2] * pgVar3->ne[3],
              lVar8 - lVar18 != 0 && lVar18 <= lVar8; lVar18 = lVar18 + 1) {
            fputc(0x23,__s);
            if (lVar18 < pgVar3->ne[1] * pgVar3->ne[0] * pgVar3->ne[2] * pgVar3->ne[3] + -1) {
              fwrite(", ",2,1,__s);
            }
          }
          fputc(0x29,__s);
        }
        fwrite("\"; ]\n",5,1,__s);
      }
      for (lVar18 = 0; lVar18 < gb->n_nodes; lVar18 = lVar18 + 1) {
        pgVar3 = gb->nodes[lVar18];
        for (uVar17 = 0; uVar17 != 10; uVar17 = uVar17 + 1) {
          if (pgVar3->src[uVar17] != (ggml_tensor *)0x0) {
            snprintf(label,0x10,"src %d",uVar17 & 0xffffffff);
            pgVar5 = pgVar3->src[uVar17];
            pgVar6 = ggml_graph_get_parent(gb,pgVar3);
            pgVar9 = ggml_graph_get_parent(gb,pgVar5);
            if (pgVar9 != (ggml_tensor *)0x0) {
              pgVar5 = pgVar9;
            }
            pcVar15 = "g";
            pcVar12 = "g";
            if (pgVar9 == (ggml_tensor *)0x0) {
              pcVar12 = "x";
            }
            bVar19 = pgVar6 == (ggml_tensor *)0x0;
            if (bVar19) {
              pcVar15 = "x";
              pgVar6 = pgVar3;
            }
            pcVar10 = "empty";
            if (bVar19) {
              pcVar10 = "vee";
            }
            pcVar14 = "dashed";
            if (bVar19) {
              pcVar14 = "solid";
            }
            fprintf(__s,"  \"%p\":%s -> \"%p\":%s [ arrowhead = %s; style = %s; label = \"%s\"; ]\n"
                    ,pgVar5,pcVar12,pgVar6,pcVar15,pcVar10,pcVar14,label);
          }
        }
      }
      for (lVar18 = 0; lVar18 < gb->n_leafs; lVar18 = lVar18 + 1) {
        pgVar3 = gb->leafs[lVar18];
        for (uVar17 = 0; uVar17 != 10; uVar17 = uVar17 + 1) {
          if (pgVar3->src[uVar17] != (ggml_tensor *)0x0) {
            snprintf(label,0x10,"src %d",uVar17 & 0xffffffff);
            fprintf(__s,"  \"%p\":%s -> \"%p\":%s [ label = \"%s\"; ]\n",pgVar3->src[uVar17],"x",
                    pgVar3,"x",label);
          }
        }
      }
      fwrite("}\n",2,1,__s);
      fclose(__s);
      ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: dot -Tpng %s -o %s.png && open %s.png\n",
                        "ggml_graph_dump_dot",filename,filename,filename);
      return;
    }
    pgVar3 = gb->nodes[uVar17];
    pgVar5 = ggml_graph_get_grad(gb,pgVar3);
    pgVar6 = ggml_graph_get_parent(gb,pgVar3);
    if (pgVar6 == (ggml_tensor *)0x0) {
      if ((pgVar3->flags & 4) == 0) {
        if (pgVar5 == (ggml_tensor *)0x0) {
          builtin_strncpy(color,"white",6);
          uVar4 = color._0_4_;
          color._0_8_ = CONCAT44(color._4_4_,uVar4);
        }
        else {
          if (gf != (ggml_cgraph *)0x0) {
            uVar7 = (ulong)(uint)gf->n_nodes;
            if (gf->n_nodes < 1) {
              uVar7 = 0;
            }
            uVar11 = 0;
            do {
              if (uVar7 == uVar11) {
                builtin_strncpy(color,"lightblue",10);
                goto LAB_00127d18;
              }
              ppgVar1 = gf->nodes + uVar11;
              uVar11 = uVar11 + 1;
            } while (*ppgVar1 != pgVar3);
          }
          builtin_strncpy(color,"green",6);
          uVar4 = color._0_4_;
          color._0_8_ = CONCAT44(color._4_4_,uVar4);
        }
      }
      else {
        builtin_strncpy(color,"yellow",7);
        uVar4 = color._0_4_;
        color._0_8_ = CONCAT44(color._4_4_,uVar4);
      }
LAB_00127d18:
      fprintf(__s,"  \"%p\" [ style = filled; fillcolor = %s; shape = record; label=\"",pgVar3,color
             );
      gVar2 = pgVar3->type;
      if (pgVar3->name[0] == '\0') {
        pcVar12 = "NONE";
        if (gVar2 < GGML_TYPE_COUNT) {
          pcVar12 = type_traits[gVar2].type_name;
        }
        fprintf(__s,"(%s)|",pcVar12);
      }
      else {
        pcVar12 = "NONE";
        if (gVar2 < GGML_TYPE_COUNT) {
          pcVar12 = type_traits[gVar2].type_name;
        }
        fprintf(__s,"%s (%s)|",pgVar3->name,pcVar12);
      }
      pcVar12 = (char *)pgVar3->ne[2];
      if ((pcVar12 == (char *)0x1) && (pgVar3->ne[3] == 1)) {
        iVar13 = pgVar3->ne[0];
        iVar16 = pgVar3->ne[1];
        pcVar12 = GGML_OP_SYMBOL[pgVar3->op];
        pcVar15 = "%d [%ld, %ld] | <x>%s";
      }
      else {
        iVar13 = pgVar3->ne[0];
        iVar16 = pgVar3->ne[1];
        pcVar15 = "%d [%ld, %ld, %ld] | <x>%s";
      }
      fprintf(__s,pcVar15,uVar17 & 0xffffffff,iVar13,iVar16,pcVar12);
      if (pgVar5 == (ggml_tensor *)0x0) {
        fwrite("\"; ]\n",5,1,__s);
      }
      else {
        fprintf(__s," | <g>%s\"; ]\n",GGML_OP_SYMBOL[pgVar5->op]);
      }
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void ggml_graph_dump_dot(const struct ggml_cgraph * gb, const struct ggml_cgraph * gf, const char * filename) {
    char color[16];

    FILE * fp = ggml_fopen(filename, "w");
    GGML_ASSERT(fp);

    fprintf(fp, "digraph G {\n");
    fprintf(fp, "  newrank = true;\n");
    fprintf(fp, "  rankdir = TB;\n");

    for (int i = 0; i < gb->n_nodes; i++) {
        struct ggml_tensor * node = gb->nodes[i];
        struct ggml_tensor * grad = ggml_graph_get_grad(gb, node);

        if (ggml_graph_get_parent(gb, node) != NULL) {
            continue;
        }

        if (node->flags & GGML_TENSOR_FLAG_PARAM) {
            snprintf(color, sizeof(color), "yellow");
        } else if (grad) {
            if (ggml_graph_find(gf, node)) {
                snprintf(color, sizeof(color), "green");
            } else {
                snprintf(color, sizeof(color), "lightblue");
            }
        } else {
            snprintf(color, sizeof(color), "white");
        }

        fprintf(fp, "  \"%p\" [ "
                    "style = filled; fillcolor = %s; shape = record; "
                    "label=\"",
                (void *) node, color);

        if (strlen(node->name) > 0) {
            fprintf(fp, "%s (%s)|", node->name, ggml_type_name(node->type));
        } else {
            fprintf(fp, "(%s)|", ggml_type_name(node->type));
        }

        if (ggml_is_matrix(node)) {
            fprintf(fp, "%d [%" PRId64 ", %" PRId64 "] | <x>%s", i, node->ne[0], node->ne[1], ggml_op_symbol(node->op));
        } else {
            fprintf(fp, "%d [%" PRId64 ", %" PRId64 ", %" PRId64 "] | <x>%s", i, node->ne[0], node->ne[1], node->ne[2], ggml_op_symbol(node->op));
        }

        if (grad) {
            fprintf(fp, " | <g>%s\"; ]\n", ggml_op_symbol(grad->op));
        } else {
            fprintf(fp, "\"; ]\n");
        }
    }

    for (int i = 0; i < gb->n_leafs; i++) {
        struct ggml_tensor * node = gb->leafs[i];

        snprintf(color, sizeof(color), "pink");

        fprintf(fp, "  \"%p\" [ "
                    "style = filled; fillcolor = %s; shape = record; "
                    "label=\"<x>",
                (void *) node, color);

        if (strlen(node->name) > 0) {
            fprintf(fp, "%s (%s)|", node->name, ggml_type_name(node->type));
        } else {
            fprintf(fp, "(%s)|", ggml_type_name(node->type));
        }

        fprintf(fp, "CONST %d [%" PRId64 ", %" PRId64 "]", i, node->ne[0], node->ne[1]);
        if (ggml_nelements(node) < 5 && node->data != NULL) {
            fprintf(fp, " | (");
            for (int j = 0; j < ggml_nelements(node); j++) {
                // FIXME: use ggml-backend to obtain the tensor data
                //if (node->type == GGML_TYPE_I8 || node->type == GGML_TYPE_I16 || node->type == GGML_TYPE_I32) {
                //    fprintf(fp, "%d", ggml_get_i32_1d(node, j));
                //}
                //else if (node->type == GGML_TYPE_F32 ||
                //         node->type == GGML_TYPE_F16 ||
                //         node->type == GGML_TYPE_BF16) {
                //    fprintf(fp, "%.1e", (double)ggml_get_f32_1d(node, j));
                //}
                //else
                {
                    fprintf(fp, "#");
                }
                if (j < ggml_nelements(node) - 1) {
                    fprintf(fp, ", ");
                }
            }
            fprintf(fp, ")");
        }
        fprintf(fp, "\"; ]\n");
    }

    for (int i = 0; i < gb->n_nodes; i++) {
        struct ggml_tensor * node = gb->nodes[i];

        for (int j = 0; j < GGML_MAX_SRC; j++) {
            if (node->src[j]) {
                char label[16];
                snprintf(label, sizeof(label), "src %d", j);
                ggml_graph_dump_dot_node_edge(fp, gb, node, node->src[j], label);
            }
        }
    }

    for (int i = 0; i < gb->n_leafs; i++) {
        struct ggml_tensor * node = gb->leafs[i];

        for (int j = 0; j < GGML_MAX_SRC; j++) {
            if (node->src[j]) {
                char label[16];
                snprintf(label, sizeof(label), "src %d", j);
                ggml_graph_dump_dot_leaf_edge(fp, node, node->src[j], label);
            }
        }
    }

    fprintf(fp, "}\n");

    fclose(fp);

    GGML_LOG_INFO("%s: dot -Tpng %s -o %s.png && open %s.png\n", __func__, filename, filename, filename);
}